

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcProjectOrder::IfcProjectOrder(IfcProjectOrder *this)

{
  *(undefined ***)&this->field_0x158 = &PTR__Object_008048a0;
  *(undefined8 *)&this->field_0x160 = 0;
  *(char **)&this->field_0x168 = "IfcProjectOrder";
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__0082ccb8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrder,_3UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x82cbd8;
  *(undefined8 *)&this->field_0x158 = 0x82cca0;
  *(undefined8 *)&this->field_0x88 = 0x82cc00;
  *(undefined8 *)&this->field_0x98 = 0x82cc28;
  *(undefined8 *)&this->field_0xd0 = 0x82cc50;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrder,_3UL>)._vptr_ObjectHelper =
       (_func_int **)0x82cc78;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrder,_3UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrder,_3UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrder,_3UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrder,_3UL>).field_0x20 = 0;
  (this->PredefinedType)._M_dataplus._M_p = (pointer)&(this->PredefinedType).field_2;
  (this->PredefinedType)._M_string_length = 0;
  (this->PredefinedType).field_2._M_local_buf[0] = '\0';
  (this->Status).ptr._M_dataplus._M_p = (pointer)&(this->Status).ptr.field_2;
  (this->Status).ptr._M_string_length = 0;
  (this->Status).ptr.field_2._M_local_buf[0] = '\0';
  (this->Status).have = false;
  return;
}

Assistant:

IfcProjectOrder() : Object("IfcProjectOrder") {}